

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O1

void __thiscall RVO::RVOSimulator::removeAgent(RVOSimulator *this,size_t agentNo)

{
  pointer *pppAVar1;
  Agent *pAVar2;
  void *pvVar3;
  
  pAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
           super__Vector_impl_data._M_start[agentNo];
  if (pAVar2 != (Agent *)0x0) {
    pvVar3 = (pAVar2->orcaPlanes_).super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)*(pointer *)
                                    ((long)&(pAVar2->orcaPlanes_).
                                            super__Vector_base<RVO::Plane,_std::allocator<RVO::Plane>_>
                                            ._M_impl + 0x10) - (long)pvVar3);
    }
    pvVar3 = (pAVar2->obstacleNeighbors_).
             super__Vector_base<const_RVO::Obstacle_*,_std::allocator<const_RVO::Obstacle_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)*(pointer *)
                                    ((long)&(pAVar2->obstacleNeighbors_).
                                            super__Vector_base<const_RVO::Obstacle_*,_std::allocator<const_RVO::Obstacle_*>_>
                                            ._M_impl + 0x10) - (long)pvVar3);
    }
    pvVar3 = (pAVar2->agentNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)*(pointer *)
                                    ((long)&(pAVar2->agentNeighbors_).
                                            super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                                            ._M_impl + 0x10) - (long)pvVar3);
    }
    operator_delete(pAVar2,0xa8);
  }
  (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_start[agentNo] =
       (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
       super__Vector_impl_data._M_finish[-1];
  pppAVar1 = &(this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  *pppAVar1 = *pppAVar1 + -1;
  return;
}

Assistant:

void RVOSimulator::removeAgent(size_t agentNo)
	{
		delete agents_[agentNo];
		agents_[agentNo] = agents_.back();
		agents_.pop_back();
	}